

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk1c(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk1c *peVar1;
  envy_bios_power_unk1c *unk1c;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk1c;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    fprintf((FILE *)out,"PERF SETTINGS script at 0x%x\n",(ulong)peVar1->offset);
    printscript((uint16_t)peVar1->offset);
    fprintf((FILE *)out,"\n");
  }
  return;
}

Assistant:

void envy_bios_print_power_unk1c(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk1c *unk1c = &bios->power.unk1c;

	if (!unk1c->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "PERF SETTINGS script at 0x%x\n", unk1c->offset);
	printscript(unk1c->offset);
	fprintf(out, "\n");
}